

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::SetTabItemClosed(char *label)

{
  uint uVar1;
  ImGuiTabBar *tab_bar;
  ImU32 tab_id;
  long lVar2;
  
  lVar2 = (long)(GImGui->CurrentTabBar).Size;
  if (0 < lVar2) {
    tab_bar = (GImGui->CurrentTabBar).Data[lVar2 + -1];
    uVar1 = tab_bar->Flags;
    if ((uVar1 >> 0x14 & 1) == 0) {
      tab_id = TabBarCalcTabID((ImGuiTabBar *)(ulong)uVar1,label);
      TabBarRemoveTab(tab_bar,tab_id);
      return;
    }
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = (g.CurrentTabBar.Size > 0) && !(g.CurrentTabBar.back()->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
        IM_ASSERT(tab_bar->WantLayout);         // Needs to be called AFTER BeginTabBar() and BEFORE the first call to BeginTabItem()
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        TabBarRemoveTab(tab_bar, tab_id);
    }
}